

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_trim_frontAndBackTrimming_fn(int _i)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x123b0e;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"   01   ",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x123b4c;
  AString_trim(&string,' ');
  if (string.capacity == 8) {
    uStack_50 = 0x123b6a;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x218);
    if (string.buffer == (char *)0x0) {
      ppcVar6 = &local_58;
      pcVar4 = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) (string).buffer != NULL";
      pcVar8 = "(void*) (string).buffer";
      iVar1 = 0x218;
LAB_00123d6b:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar6 + -8) = test_AString_trim_completeString_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar1,pcVar4,pcVar3,pcVar7,pcVar8);
    }
    uStack_50 = 0x123b87;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x218);
    pcVar8 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar3 = "";
      pcVar8 = "(null)";
    }
    else {
      uStack_50 = 0x123ba4;
      iVar1 = strcmp("01",string.buffer);
      if (iVar1 == 0) {
        uStack_50 = 0x123bbd;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x218);
        if (string.size == 2) {
          uStack_50 = 0x123bdd;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x218);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_50 = 0x123bfe;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x219);
            uStack_50 = 0x123c07;
            (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
            return;
          }
          ppcVar6 = &local_68;
          local_60 = "(0)";
          local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar7 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount";
          iVar1 = 0x219;
          goto LAB_00123d6b;
        }
        local_60 = "strlen(\"01\")";
        pcVar4 = "(string).size == strlen(\"01\")";
        pcVar7 = "(string).size";
        local_58 = (char *)0x2;
        pcVar3 = (char *)string.size;
        goto LAB_00123d1e;
      }
      pcVar3 = "\"";
    }
    expr = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar4 = "(string).buffer == (\"01\")";
    pcVar7 = "(string).buffer";
    local_58 = "\"";
    local_60 = "01";
    local_68 = "\"";
    pcStack_70 = "(\"01\")";
    ppcVar5 = &pcStack_80;
    pcStack_80 = pcVar8;
    pcStack_78 = pcVar3;
  }
  else {
    local_60 = "(8)";
    pcVar4 = "(string).capacity == (8)";
    pcVar7 = "(string).capacity";
    local_58 = (char *)0x8;
    pcVar3 = (char *)string.capacity;
LAB_00123d1e:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &local_60;
  }
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar3;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x123d27;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x218,expr,pcVar2,pcVar4,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_trim_frontAndBackTrimming)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("   01   ", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    AString_trim(&string, ' ');
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}